

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DIS_Logger_Record.cpp
# Opt level: O1

void __thiscall
KDIS::UTILS::DIS_Logger_Record::DIS_Logger_Record
          (DIS_Logger_Record *this,KString *FileName,KBOOL WriteToFile)

{
  std::fstream::fstream(this);
  this->m_bWriteToFile = WriteToFile;
  (this->m_vsLog).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vsLog).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vsLog).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::fstream::open((char *)this,(_Ios_Openmode)(FileName->_M_dataplus)._M_p);
  return;
}

Assistant:

DIS_Logger_Record::DIS_Logger_Record( const KString & FileName, KBOOL WriteToFile ) :
    m_bWriteToFile( WriteToFile )
{
    m_File.open( FileName.c_str(), ios::out );
}